

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O2

void __thiscall QWidgetItem::setGeometry(QWidgetItem *this,QRect *rect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  QSizePolicy QVar5;
  int iVar6;
  int iVar7;
  LayoutDirection direction;
  Alignment AVar8;
  Representation ax;
  Representation RVar9;
  QSize QVar10;
  int extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  uint uVar11;
  int iVar12;
  uint ay;
  int iVar13;
  int iVar14;
  Representation RVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  QRect QVar19;
  
  iVar2 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[8])();
  if ((char)iVar2 == '\0') {
    bVar1 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (bVar1) {
      QVar19 = *rect;
    }
    else {
      QVar19 = fromLayoutItemRect(*(QWidgetPrivate **)&this->wid->field_0x8,rect);
    }
    iVar17 = QVar19.x2.m_i.m_i + 1;
    ax = QVar19.x1.m_i;
    iVar18 = iVar17 - ax.m_i;
    iVar12 = QVar19.y2.m_i.m_i + 1;
    RVar9 = QVar19.y1.m_i;
    iVar13 = iVar12 - RVar9.m_i;
    QVar10 = QRect::size(rect);
    iVar16 = iVar18 - QVar10.wd.m_i;
    iVar14 = iVar13 - QVar10.ht.m_i;
    iVar3 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[4])(this);
    iVar2 = iVar16 + iVar3;
    if (iVar18 < iVar16 + iVar3) {
      iVar2 = iVar18;
    }
    iVar3 = extraout_var + iVar14;
    if (iVar13 < extraout_var + iVar14) {
      iVar3 = iVar13;
    }
    iVar7 = iVar3;
    if (((this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1ff) != 0) {
      RVar4.m_i = (*(this->super_QLayoutItem)._vptr_QLayoutItem[2])(this);
      QVar5 = QWidget::sizePolicy(this->wid);
      if (((uint)QVar5.field_0 & 0xf0000) == 0xd0000) {
        iVar6 = (**(code **)(*(long *)this->wid + 0x70))();
        QVar10 = QWidget::minimumSize(this->wid);
        RVar4.m_i = QVar10.wd.m_i.m_i;
        if (QVar10.wd.m_i.m_i < iVar6) {
          RVar4.m_i = iVar6;
        }
      }
      RVar15.m_i = extraout_var_00;
      if (((uint)QVar5.field_0 & 0xf00000) == 0xd00000) {
        (**(code **)(*(long *)this->wid + 0x70))();
        QVar10 = QWidget::minimumSize(this->wid);
        RVar15 = QVar10.ht.m_i;
        if (RVar15.m_i < extraout_var_01) {
          RVar15.m_i = extraout_var_01;
        }
      }
      uVar11 = (this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i;
      iVar6 = RVar4.m_i + iVar16;
      if (iVar2 < RVar4.m_i + iVar16) {
        iVar6 = iVar2;
      }
      if ((uVar11 & 0x1f) == 0) {
        iVar6 = iVar2;
      }
      iVar2 = iVar6;
      if ((uVar11 & 0x1e0) != 0) {
        iVar7 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[9])(this);
        if ((char)iVar7 == '\0') {
          iVar7 = RVar15.m_i + iVar14;
          if (iVar3 < RVar15.m_i + iVar14) {
            iVar7 = iVar3;
          }
        }
        else {
          iVar16 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[10])
                             (this,(ulong)(uint)(iVar2 - iVar16));
          iVar7 = iVar16 + iVar14;
          if (iVar3 < iVar16 + iVar14) {
            iVar7 = iVar3;
          }
        }
      }
    }
    direction = QWidget::layoutDirection(this->wid);
    AVar8 = QStyle::visualAlignment
                      (direction,
                       (Alignment)
                       (this->super_QLayoutItem).align.
                       super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i);
    if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) == 0) {
      if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) == 0) {
        ax.m_i = (iVar18 - iVar2) / 2 + ax.m_i;
      }
    }
    else {
      ax.m_i = iVar17 - iVar2;
    }
    uVar11 = (this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
    if ((uVar11 & 0x40) == 0) {
      if ((uVar11 & 0x20) == 0) {
        RVar9.m_i = (iVar13 - iVar7) / 2 + RVar9.m_i;
      }
    }
    else {
      RVar9.m_i = iVar12 - iVar7;
    }
    uVar11 = ax.m_i >> 0x1f & ax.m_i;
    if (ax.m_i < 1) {
      ax.m_i = 0;
    }
    ay = 0;
    if (0 < RVar9.m_i) {
      ay = RVar9.m_i;
    }
    QWidget::setGeometry(this->wid,ax.m_i,ay,uVar11 + iVar2,(RVar9.m_i >> 0x1f & RVar9.m_i) + iVar7)
    ;
    return;
  }
  return;
}

Assistant:

void QWidgetItem::setGeometry(const QRect &rect)
{
    if (isEmpty())
        return;

    QRect r = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
            ? fromLayoutItemRect(wid->d_func(), rect)
            : rect;
    const QSize widgetRectSurplus = r.size() - rect.size();

    /*
       For historical reasons, this code is done using widget rect
       coordinates, not layout item rect coordinates. However,
       QWidgetItem's sizeHint(), maximumSize(), and heightForWidth()
       all work in terms of layout item rect coordinates, so we have to
       add or subtract widgetRectSurplus here and there. The code could
       be much simpler if we did everything using layout item rect
       coordinates and did the conversion right before the call to
       QWidget::setGeometry().
     */

    QSize s = r.size().boundedTo(maximumSize() + widgetRectSurplus);
    int x = r.x();
    int y = r.y();
    if (align & (Qt::AlignHorizontal_Mask | Qt::AlignVertical_Mask)) {
        QSize pref(sizeHint());
        QSizePolicy sp = wid->sizePolicy();
        if (sp.horizontalPolicy() == QSizePolicy::Ignored)
            pref.setWidth(wid->sizeHint().expandedTo(wid->minimumSize()).width());
        if (sp.verticalPolicy() == QSizePolicy::Ignored)
            pref.setHeight(wid->sizeHint().expandedTo(wid->minimumSize()).height());
        pref += widgetRectSurplus;
        if (align & Qt::AlignHorizontal_Mask)
            s.setWidth(qMin(s.width(), pref.width()));
        if (align & Qt::AlignVertical_Mask) {
            if (hasHeightForWidth())
                s.setHeight(qMin(s.height(),
                                 heightForWidth(s.width() - widgetRectSurplus.width())
                                 + widgetRectSurplus.height()));
            else
                s.setHeight(qMin(s.height(), pref.height()));
        }
    }
    Qt::Alignment alignHoriz = QStyle::visualAlignment(wid->layoutDirection(), align);
    if (alignHoriz & Qt::AlignRight)
        x = x + (r.width() - s.width());
    else if (!(alignHoriz & Qt::AlignLeft))
        x = x + (r.width() - s.width()) / 2;

    if (align & Qt::AlignBottom)
        y = y + (r.height() - s.height());
    else if (!(align & Qt::AlignTop))
        y = y + (r.height() - s.height()) / 2;

    // Make sure we don't move outside of the parent, e.g when styles demand
    // surplus space that exceeds the available margins (f.ex macOS with QGroupBox)
    if (x < 0) {
        s.rwidth() += x;
        x = 0;
    }
    if (y < 0) {
        s.rheight() += y;
        y = 0;
    }

    wid->setGeometry(x, y, s.width(), s.height());
}